

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMatrix.cpp
# Opt level: O1

void __thiscall
dgMatrix::TransformTriplex
          (dgMatrix *this,HaF64 *dst,HaI32 dstStrideInBytes,HaF64 *src,HaI32 srcStrideInBytes,
          HaI32 count)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  double dVar7;
  HaF64 *pHVar8;
  double *pdVar9;
  undefined8 in_XMM0_Qa;
  undefined1 auVar10 [16];
  undefined8 in_XMM2_Qa;
  undefined1 auVar11 [16];
  undefined8 in_XMM4_Qa;
  undefined1 auVar12 [16];
  undefined8 in_XMM6_Qa;
  undefined1 auVar13 [16];
  undefined8 in_XMM8_Qa;
  undefined1 auVar14 [16];
  undefined8 in_XMM10_Qa;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  if (0 < count) {
    auVar10._0_8_ = (double)(this->m_front).super_dgTemplateVector<float>.m_x;
    auVar10._8_8_ = in_XMM0_Qa;
    fVar1 = (this->m_up).super_dgTemplateVector<float>.m_x;
    auVar11._0_8_ = (double)(this->m_right).super_dgTemplateVector<float>.m_x;
    auVar11._8_8_ = in_XMM2_Qa;
    fVar2 = (this->m_posit).super_dgTemplateVector<float>.m_x;
    auVar12._0_8_ = (double)(this->m_front).super_dgTemplateVector<float>.m_y;
    auVar12._8_8_ = in_XMM4_Qa;
    fVar3 = (this->m_up).super_dgTemplateVector<float>.m_y;
    auVar13._0_8_ = (double)(this->m_right).super_dgTemplateVector<float>.m_y;
    auVar13._8_8_ = in_XMM6_Qa;
    fVar4 = (this->m_posit).super_dgTemplateVector<float>.m_y;
    auVar14._0_8_ = (double)(this->m_front).super_dgTemplateVector<float>.m_z;
    auVar14._8_8_ = in_XMM8_Qa;
    fVar5 = (this->m_up).super_dgTemplateVector<float>.m_z;
    auVar15._0_8_ = (double)(this->m_right).super_dgTemplateVector<float>.m_z;
    auVar15._8_8_ = in_XMM10_Qa;
    fVar6 = (this->m_posit).super_dgTemplateVector<float>.m_z;
    pHVar8 = src + 2;
    pdVar9 = (double *)(dst + 2);
    do {
      auVar16._8_8_ = 0;
      auVar16._0_8_ = pHVar8[-2];
      dVar7 = (double)pHVar8[-1];
      auVar18._8_8_ = 0;
      auVar18._0_8_ = *pHVar8;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = dVar7 * (double)fVar1;
      auVar17 = vfmadd231sd_fma(auVar19,auVar16,auVar10);
      auVar17 = vfmadd231sd_fma(auVar17,auVar18,auVar11);
      pdVar9[-2] = auVar17._0_8_ + (double)fVar2;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = dVar7 * (double)fVar3;
      auVar17 = vfmadd231sd_fma(auVar20,auVar16,auVar12);
      auVar17 = vfmadd231sd_fma(auVar17,auVar18,auVar13);
      pdVar9[-1] = auVar17._0_8_ + (double)fVar4;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = dVar7 * (double)fVar5;
      auVar17 = vfmadd231sd_fma(auVar17,auVar14,auVar16);
      auVar17 = vfmadd231sd_fma(auVar17,auVar15,auVar18);
      *pdVar9 = auVar17._0_8_ + (double)fVar6;
      pHVar8 = pHVar8 + (srcStrideInBytes >> 3);
      pdVar9 = pdVar9 + (dstStrideInBytes >> 3);
      count = count + -1;
    } while (count != 0);
  }
  return;
}

Assistant:

void dgMatrix::TransformTriplex (hacd::HaF64* const dst, hacd::HaI32 dstStrideInBytes, const hacd::HaF64* const src, hacd::HaI32 srcStrideInBytes, hacd::HaI32 count) const
{
	hacd::HaI32 dstStride = dstStrideInBytes /sizeof (hacd::HaF64);
	hacd::HaI32 srcStride = srcStrideInBytes / sizeof (hacd::HaF64);

	hacd::HaI32 dstIndex = 0;
	hacd::HaI32 srcIndex = 0;
	for (hacd::HaI32 i = 0 ; i < count; i ++ ) {
		hacd::HaF64 x = src[srcIndex + 0];
		hacd::HaF64 y = src[srcIndex + 1];
		hacd::HaF64 z = src[srcIndex + 2];
		srcIndex += srcStride;
		dst[dstIndex + 0] = x * m_front.m_x + y * m_up.m_x + z * m_right.m_x + m_posit.m_x;
		dst[dstIndex + 1] = x * m_front.m_y + y * m_up.m_y + z * m_right.m_y + m_posit.m_y;
		dst[dstIndex + 2] = x * m_front.m_z + y * m_up.m_z + z * m_right.m_z + m_posit.m_z;
		dstIndex += dstStride;
	}
}